

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenArraySetSetIndex(BinaryenExpressionRef expr,BinaryenExpressionRef indexExpr)

{
  if (expr->_id != ArraySetId) {
    __assert_fail("expression->is<ArraySet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x1163,
                  "void BinaryenArraySetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (indexExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)indexExpr;
    return;
  }
  __assert_fail("indexExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x1164,
                "void BinaryenArraySetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArraySetSetIndex(BinaryenExpressionRef expr,
                              BinaryenExpressionRef indexExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArraySet>());
  assert(indexExpr);
  static_cast<ArraySet*>(expression)->index = (Expression*)indexExpr;
}